

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_name_unittest.cc
# Opt level: O0

void __thiscall
bssl::ParseNameTest_TeletexSafeStringValue_Test::~ParseNameTest_TeletexSafeStringValue_Test
          (ParseNameTest_TeletexSafeStringValue_Test *this)

{
  ParseNameTest_TeletexSafeStringValue_Test *this_local;
  
  ~ParseNameTest_TeletexSafeStringValue_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParseNameTest, TeletexSafeStringValue) {
  const uint8_t der[] = {
      0x46, 0x6f, 0x6f, 0x20, 0x62, 0x61, 0x72,
  };
  X509NameAttribute value(der::Input(), CBS_ASN1_T61STRING, der::Input(der));
  std::string result_unsafe;
  ASSERT_TRUE(value.ValueAsStringUnsafe(&result_unsafe));
  ASSERT_EQ("Foo bar", result_unsafe);
  std::string result;
  ASSERT_TRUE(value.ValueAsString(&result));
  ASSERT_EQ("Foo bar", result);
}